

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerHLSL::to_semantic_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,uint32_t location,ExecutionModel em,
          StorageClass sc)

{
  pointer pcVar1;
  HLSLVertexAttributeRemap *pHVar2;
  undefined4 in_register_0000000c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *ts_1;
  bool bVar3;
  char local_14 [4];
  
  ts_1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)CONCAT44(in_register_0000000c,em);
  if (sc == Input && em == ExecutionModelVertex) {
    ts_1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(this->remap_vertex_attributes).
              super_VectorView<spirv_cross::HLSLVertexAttributeRemap>.buffer_size;
    bVar3 = ts_1 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
    if (!bVar3) {
      pHVar2 = (this->remap_vertex_attributes).
               super_VectorView<spirv_cross::HLSLVertexAttributeRemap>.ptr;
      if (pHVar2->location != location) {
        ts_1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)ts_1 * 0x28);
        do {
          ts_1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)((long)ts_1 + -0x28);
          bVar3 = ts_1 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x0;
          if (bVar3) goto LAB_001d2230;
          pHVar2 = pHVar2 + 1;
        } while (pHVar2->location != location);
      }
      ts_1 = &__return_storage_ptr__->field_2;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)ts_1;
      pcVar1 = (pHVar2->semantic)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar1,
                 pcVar1 + (pHVar2->semantic)._M_string_length);
      if (!bVar3) {
        return __return_storage_ptr__;
      }
    }
  }
LAB_001d2230:
  join<char_const(&)[9],unsigned_int&>
            (__return_storage_ptr__,(spirv_cross *)"TEXCOORD",(char (*) [9])local_14,
             (uint *)&ts_1->_M_allocated_capacity);
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerHLSL::to_semantic(uint32_t location, ExecutionModel em, StorageClass sc)
{
	if (em == ExecutionModelVertex && sc == StorageClassInput)
	{
		// We have a vertex attribute - we should look at remapping it if the user provided
		// vertex attribute hints.
		for (auto &attribute : remap_vertex_attributes)
			if (attribute.location == location)
				return attribute.semantic;
	}

	// Not a vertex attribute, or no remap_vertex_attributes entry.
	return join("TEXCOORD", location);
}